

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationAPITest::prepareAttribLocation
          (VertexAttribLocationAPITest *this,Program *program,ProgramInterface *program_interface)

{
  int iVar1;
  GLenum err;
  undefined4 extraout_var;
  Functions *gl;
  
  iVar1 = (*((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  (*gl->bindAttribLocation)(program->m_id,6,"goten");
  err = (*gl->getError)();
  glu::checkError(err,"BindAttribLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x4a28);
  Utils::Program::Link(gl,program->m_id);
  TextureTestBase::prepareAttribLocation((TextureTestBase *)gl,program,program_interface);
  return;
}

Assistant:

void VertexAttribLocationAPITest::prepareAttribLocation(Utils::Program&			 program,
														Utils::ProgramInterface& program_interface)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindAttribLocation(program.m_id, m_goten_location, "goten");
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindAttribLocation");

	program.Link(gl, program.m_id);

	/* We still need to get locations for gohan and chichi */
	TextureTestBase::prepareAttribLocation(program, program_interface);
}